

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsTypesX.hpp
# Opt level: O2

void __thiscall
Diligent::PipelineResourceLayoutDescX::PipelineResourceLayoutDescX
          (PipelineResourceLayoutDescX *this,PipelineResourceLayoutDescX *param_1)

{
  pointer pSVar1;
  pointer pIVar2;
  Uint32 UVar3;
  undefined4 uVar4;
  SHADER_RESOURCE_VARIABLE_TYPE SVar5;
  undefined3 uVar6;
  SHADER_TYPE SVar7;
  Uint32 UVar8;
  undefined4 uVar9;
  
  (this->super_PipelineResourceLayoutDesc).ImmutableSamplers =
       (param_1->super_PipelineResourceLayoutDesc).ImmutableSamplers;
  SVar5 = (param_1->super_PipelineResourceLayoutDesc).DefaultVariableType;
  uVar6 = *(undefined3 *)&(param_1->super_PipelineResourceLayoutDesc).field_0x1;
  SVar7 = (param_1->super_PipelineResourceLayoutDesc).DefaultVariableMergeStages;
  UVar8 = (param_1->super_PipelineResourceLayoutDesc).NumVariables;
  uVar9 = *(undefined4 *)&(param_1->super_PipelineResourceLayoutDesc).field_0xc;
  UVar3 = (param_1->super_PipelineResourceLayoutDesc).NumImmutableSamplers;
  uVar4 = *(undefined4 *)&(param_1->super_PipelineResourceLayoutDesc).field_0x1c;
  (this->super_PipelineResourceLayoutDesc).Variables =
       (param_1->super_PipelineResourceLayoutDesc).Variables;
  (this->super_PipelineResourceLayoutDesc).NumImmutableSamplers = UVar3;
  *(undefined4 *)&(this->super_PipelineResourceLayoutDesc).field_0x1c = uVar4;
  (this->super_PipelineResourceLayoutDesc).DefaultVariableType = SVar5;
  *(undefined3 *)&(this->super_PipelineResourceLayoutDesc).field_0x1 = uVar6;
  (this->super_PipelineResourceLayoutDesc).DefaultVariableMergeStages = SVar7;
  (this->super_PipelineResourceLayoutDesc).NumVariables = UVar8;
  *(undefined4 *)&(this->super_PipelineResourceLayoutDesc).field_0xc = uVar9;
  pSVar1 = (param_1->VarCopy).
           super__Vector_base<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->VarCopy).
  super__Vector_base<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->VarCopy).
       super__Vector_base<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->VarCopy).
  super__Vector_base<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
  ._M_impl.super__Vector_impl_data._M_finish = pSVar1;
  (this->VarCopy).
  super__Vector_base<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->VarCopy).
       super__Vector_base<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->VarCopy).
  super__Vector_base<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->VarCopy).
  super__Vector_base<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (param_1->VarCopy).
  super__Vector_base<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pIVar2 = (param_1->ImtblSamCopy).
           super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->ImtblSamCopy).
  super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->ImtblSamCopy).
       super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->ImtblSamCopy).
  super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
  ._M_impl.super__Vector_impl_data._M_finish = pIVar2;
  (this->ImtblSamCopy).
  super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->ImtblSamCopy).
       super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->ImtblSamCopy).
  super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->ImtblSamCopy).
  super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (param_1->ImtblSamCopy).
  super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_Hashtable(&(this->StringPool)._M_h,&(param_1->StringPool)._M_h);
  return;
}

Assistant:

PipelineResourceLayoutDescX(PipelineResourceLayoutDescX&&) noexcept = default;